

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlOutputBufferWriteEscape
              (xmlOutputBufferPtr out,xmlChar *str,xmlCharEncodingOutputFunc escaping)

{
  int iVar1;
  xmlChar *__s;
  size_t sVar2;
  int local_450;
  int local_44c;
  int c_in;
  int c_out;
  xmlChar buf [1024];
  char *escaped;
  size_t len;
  int written;
  int ret;
  xmlCharEncodingOutputFunc escaping_local;
  xmlChar *str_local;
  xmlOutputBufferPtr out_local;
  
  len._0_4_ = 0;
  if (((out == (xmlOutputBufferPtr)0x0) || (out->error != 0)) || (str == (xmlChar *)0x0)) {
    out_local._4_4_ = -1;
  }
  else {
    escaped = (char *)strlen((char *)str);
    if (escaped < (char *)0x7fffffff) {
      escaping_local = (xmlCharEncodingOutputFunc)str;
      if (escaping == (xmlCharEncodingOutputFunc)0x0) {
        __s = xmlEscapeText(str,0x10);
        if (__s == (xmlChar *)0x0) {
          out->error = 2;
          out_local._4_4_ = -1;
        }
        else {
          sVar2 = strlen((char *)__s);
          if (sVar2 < 0x7fffffff) {
            out_local._4_4_ = xmlOutputBufferWrite(out,(int)sVar2,(char *)__s);
            (*xmlFree)(__s);
          }
          else {
            out->error = 0x72;
            out_local._4_4_ = -1;
          }
        }
      }
      else {
        while (escaped != (char *)0x0) {
          local_44c = 0x400;
          local_450 = (int)escaped;
          iVar1 = (*escaping)((uchar *)&c_in,&local_44c,(uchar *)escaping_local,&local_450);
          if (iVar1 < 0) {
            out->error = 2;
            return -1;
          }
          escaping_local = escaping_local + local_450;
          escaped = escaped + -(long)local_450;
          iVar1 = xmlOutputBufferWrite(out,local_44c,(char *)&c_in);
          if (iVar1 < 0) {
            return iVar1;
          }
          len._0_4_ = iVar1 + (int)len;
        }
        out_local._4_4_ = (int)len;
      }
    }
    else {
      out->error = 0x72;
      out_local._4_4_ = -1;
    }
  }
  return out_local._4_4_;
}

Assistant:

int
xmlOutputBufferWriteEscape(xmlOutputBufferPtr out, const xmlChar *str,
                           xmlCharEncodingOutputFunc escaping) {
    int ret;
    int written = 0;
    size_t len;

    if ((out == NULL) || (out->error) || (str == NULL))
        return(-1);

    len = strlen((const char *) str);
    if (len >= INT_MAX) {
        out->error = XML_ERR_RESOURCE_LIMIT;
        return(-1);
    }

    if (escaping == NULL) {
        char *escaped = (char *) xmlEscapeText(str, XML_ESCAPE_ALLOW_INVALID);

        if (escaped == NULL) {
            out->error = XML_ERR_NO_MEMORY;
            return(-1);
        }

        len = strlen(escaped);
        if (len >= INT_MAX) {
            out->error = XML_ERR_RESOURCE_LIMIT;
            return(-1);
        }

        ret = xmlOutputBufferWrite(out, len, escaped);

        xmlFree(escaped);
        return(ret);
    }

    while (len > 0) {
        xmlChar buf[1024];
        int c_out;
        int c_in;

	c_out = 1024;
	c_in = len;

        ret = escaping(buf, &c_out, str, &c_in);
        if (ret < 0) {
            out->error = XML_ERR_NO_MEMORY;
            return(-1);
        }
        str += c_in;
        len -= c_in;

        ret = xmlOutputBufferWrite(out, c_out, (char *) buf);
        if (ret < 0)
            return(ret);
        written += ret;
    }

    return(written);
}